

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
Shell::assertModule(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertModule *assn)

{
  ModuleAssertionType MVar1;
  undefined1 local_c8 [8];
  Result<std::shared_ptr<wasm::Module>_> wasm;
  Result<wasm::Ok> valid;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  instance;
  allocator<char> local_29;
  
  makeModule((Result<std::shared_ptr<wasm::Module>_> *)local_c8,this,&assn->wasm);
  if (wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_u._24_1_ == '\x01')
  {
    if (assn->type - Malformed < 2) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      goto LAB_0014cb8c;
    }
    std::__cxx11::string::string
              ((string *)
               ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20),
               (string *)local_c8);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20));
  }
  else {
    if (assn->type != Malformed) {
      validateModule((Result<wasm::Ok> *)
                     ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20
                     ),this,(Module *)local_c8);
      if (valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        if (assn->type == Invalid) {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        }
        else {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                             super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20
                     ));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                     (__index_type *)
                     ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
LAB_0014cacb:
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
      }
      else {
        if (assn->type == Invalid) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                     "expected invalid module",
                     (allocator<char> *)
                     ((long)&instance.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                     (__index_type *)
                     ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          goto LAB_0014cacb;
        }
        instantiate((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                     *)((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),this,
                    (Module *)local_c8);
        MVar1 = assn->type;
        if (instance.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
          if ((MVar1 != Unlinkable) && (MVar1 != Trap)) {
            std::__cxx11::string::string
                      ((string *)
                       ((long)&instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       + 0x20),(string *)
                               ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                       (__index_type *)
                       ((long)&instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       + 0x20));
            goto LAB_0014cb6e;
          }
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        }
        else {
          if (MVar1 == Trap) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)
                       ((long)&instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       + 0x20),"expected instantiation to trap",&local_29);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                       (__index_type *)
                       ((long)&instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       + 0x20));
          }
          else {
            if (MVar1 != Unlinkable) {
              ::wasm::handle_unreachable
                        ("unexpected module assertion",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                         ,0x1b8);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)
                       ((long)&instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       + 0x20),"expected unlinkable module",&local_29);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                       (__index_type *)
                       ((long)&instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       + 0x20));
          }
LAB_0014cb6e:
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&instance.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 0x20));
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             *)((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20));
      goto LAB_0014cb8c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20),
               "expected malformed module",
               (allocator<char> *)
               ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20));
  }
  std::__cxx11::string::~string
            ((string *)
             ((long)&wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20));
LAB_0014cb8c:
  std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Result<> assertModule(AssertModule& assn) {
    auto wasm = makeModule(assn.wasm);
    if (const auto* err = wasm.getErr()) {
      if (assn.type == ModuleAssertionType::Malformed ||
          assn.type == ModuleAssertionType::Invalid) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Malformed) {
      return Err{"expected malformed module"};
    }

    auto valid = validateModule(**wasm);
    if (auto* err = valid.getErr()) {
      if (assn.type == ModuleAssertionType::Invalid) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Invalid) {
      return Err{"expected invalid module"};
    }

    auto instance = instantiate(**wasm);
    if (auto* err = instance.getErr()) {
      if (assn.type == ModuleAssertionType::Unlinkable ||
          assn.type == ModuleAssertionType::Trap) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Unlinkable) {
      return Err{"expected unlinkable module"};
    }
    if (assn.type == ModuleAssertionType::Trap) {
      return Err{"expected instantiation to trap"};
    }

    WASM_UNREACHABLE("unexpected module assertion");
  }